

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

bool __thiscall sglr::rc::Texture2D::isComplete(Texture2D *this)

{
  PixelBufferAccess *pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  TextureFormat *format;
  uint uVar7;
  size_t *psVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar2;
  if ((0xd < uVar6) || ((this->m_levels).m_data[uVar6].m_cap == 0)) {
    return false;
  }
  if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
    return true;
  }
  pPVar1 = (this->m_levels).m_access + uVar6;
  uVar3 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[0];
  uVar4 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[1];
  uVar9 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
  uVar10 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar10 = uVar3;
  }
  uVar7 = 0x20;
  if (uVar10 != 0) {
    uVar7 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  uVar10 = 0x20 - uVar7;
  if ((int)uVar9 < (int)(0x20 - uVar7)) {
    uVar10 = uVar9;
  }
  if (1 < (int)uVar10) {
    piVar11 = (this->m_levels).m_access[uVar6 + 1].super_ConstPixelBufferAccess.m_size.m_data + 1;
    psVar8 = &(this->m_levels).m_data[uVar6 + 1].m_cap;
    uVar6 = 1;
    do {
      if ((0xe - uVar2 == uVar6) || (*psVar8 == 0)) {
        return false;
      }
      iVar5 = (int)uVar3 >> ((byte)uVar6 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      if (((IVec3 *)(piVar11 + -1))->m_data[0] != iVar5) {
        return false;
      }
      iVar5 = (int)uVar4 >> ((byte)uVar6 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      if (*piVar11 != iVar5) {
        return false;
      }
      if (piVar11[-3] != (pPVar1->super_ConstPixelBufferAccess).m_format.order) {
        return false;
      }
      if (piVar11[-2] != (pPVar1->super_ConstPixelBufferAccess).m_format.type) {
        return false;
      }
      uVar6 = uVar6 + 1;
      piVar11 = piVar11 + 10;
      psVar8 = psVar8 + 2;
    } while (uVar10 != uVar6);
  }
  return true;
}

Assistant:

int							getBaseLevel	(void) const	{ return m_baseLevel;		}